

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O0

shared_ptr<duckdb::ExtraTypeInfo,_true>
duckdb::ExtraTypeInfo::Deserialize(Deserializer *deserializer)

{
  undefined8 uVar1;
  ExtraTypeInfo *this;
  ExtraTypeInfo *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Deserializer *in_RDI;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar2;
  shared_ptr<duckdb::ExtraTypeInfo,_true> result;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
  extension_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> alias;
  ExtraTypeInfoType type;
  string *in_stack_fffffffffffffe88;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *in_stack_fffffffffffffe90;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *in_stack_fffffffffffffe98;
  Deserializer *in_stack_fffffffffffffea0;
  allocator *paVar3;
  undefined8 in_stack_fffffffffffffea8;
  field_id_t field_id;
  Deserializer *args;
  field_id_t in_stack_fffffffffffffec6;
  Deserializer *in_stack_fffffffffffffec8;
  Deserializer *in_stack_fffffffffffffed8;
  field_id_t in_stack_fffffffffffffee6;
  Deserializer *in_stack_fffffffffffffee8;
  Deserializer *in_stack_fffffffffffffef8;
  Deserializer *in_stack_ffffffffffffff08;
  Deserializer *in_stack_ffffffffffffff38;
  Deserializer *in_stack_ffffffffffffff68;
  string local_38 [39];
  ExtraTypeInfoType local_11;
  
  field_id = (field_id_t)((ulong)in_stack_fffffffffffffea8 >> 0x30);
  args = in_RDI;
  local_11 = Deserializer::ReadProperty<duckdb::ExtraTypeInfoType>
                       (in_stack_fffffffffffffea0,
                        (field_id_t)((ulong)in_stack_fffffffffffffe98 >> 0x30),
                        (char *)in_stack_fffffffffffffe90);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee6,(char *)in_stack_fffffffffffffed8);
  Deserializer::ReadDeletedProperty<duckdb::vector<duckdb::Value,true>>
            (in_RDI,field_id,(char *)in_stack_fffffffffffffea0);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ExtensionTypeInfo,std::default_delete<duckdb::ExtensionTypeInfo>,true>>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec6,(char *)args);
  shared_ptr<duckdb::ExtraTypeInfo,_true>::shared_ptr
            ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea270);
  switch(local_11) {
  case INVALID_TYPE_INFO:
    shared_ptr<duckdb::ExtraTypeInfo,_true>::shared_ptr
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    goto LAB_00aea6d6;
  case GENERIC_TYPE_INFO:
    make_shared_ptr<duckdb::ExtraTypeInfo,duckdb::ExtraTypeInfoType&>((ExtraTypeInfoType *)args);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea458);
    break;
  case DECIMAL_TYPE_INFO:
    DecimalTypeInfo::Deserialize(in_stack_fffffffffffffee8);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea3dc);
    break;
  case STRING_TYPE_INFO:
    StringTypeInfo::Deserialize(in_stack_fffffffffffffed8);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea532);
    break;
  case LIST_TYPE_INFO:
    ListTypeInfo::Deserialize(in_stack_fffffffffffffed8);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea4f4);
    break;
  case STRUCT_TYPE_INFO:
    StructTypeInfo::Deserialize(in_stack_fffffffffffffed8);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea567);
    break;
  case ENUM_TYPE_INFO:
    EnumTypeInfo::Deserialize(in_stack_ffffffffffffff38);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea41a);
    break;
  case USER_TYPE_INFO:
    UserTypeInfo::Deserialize(in_stack_ffffffffffffff68);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea59c);
    break;
  case AGGREGATE_STATE_TYPE_INFO:
    AggregateStateTypeInfo::Deserialize(in_stack_fffffffffffffef8);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea309);
    break;
  case ARRAY_TYPE_INFO:
    ArrayTypeInfo::Deserialize(in_stack_ffffffffffffff08);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea39e);
    break;
  case ANY_TYPE_INFO:
    AnyTypeInfo::Deserialize(in_stack_fffffffffffffee8);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea360);
    break;
  case INTEGER_LITERAL_TYPE_INFO:
    IntegerLiteralTypeInfo::Deserialize(in_stack_fffffffffffffed8);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea496);
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x10);
    paVar3 = (allocator *)&stack0xfffffffffffffec7;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffec8,
               "Unsupported type for deserialization of ExtraTypeInfo!",paVar3);
    SerializationException::SerializationException
              ((SerializationException *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    __cxa_throw(uVar1,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  this = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(in_stack_fffffffffffffe90);
  ::std::__cxx11::string::operator=((string *)&this->alias,local_38);
  other = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->
                    ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)this);
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>::
  operator=((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
             *)this,(unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
                     *)other);
  shared_ptr<duckdb::ExtraTypeInfo,_true>::shared_ptr
            ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)this,
             (shared_ptr<duckdb::ExtraTypeInfo,_true> *)other);
LAB_00aea6d6:
  shared_ptr<duckdb::ExtraTypeInfo,_true>::~shared_ptr
            ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)0xaea6e3);
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
               *)0xaea6f0);
  ::std::__cxx11::string::~string(local_38);
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)args;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ExtraTypeInfo::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<ExtraTypeInfoType>(100, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(101, "alias");
	deserializer.ReadDeletedProperty<vector<Value>>(102, "modifiers");
	auto extension_info = deserializer.ReadPropertyWithDefault<unique_ptr<ExtensionTypeInfo>>(103, "extension_info");
	shared_ptr<ExtraTypeInfo> result;
	switch (type) {
	case ExtraTypeInfoType::AGGREGATE_STATE_TYPE_INFO:
		result = AggregateStateTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ANY_TYPE_INFO:
		result = AnyTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ARRAY_TYPE_INFO:
		result = ArrayTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::DECIMAL_TYPE_INFO:
		result = DecimalTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::ENUM_TYPE_INFO:
		result = EnumTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::GENERIC_TYPE_INFO:
		result = make_shared_ptr<ExtraTypeInfo>(type);
		break;
	case ExtraTypeInfoType::INTEGER_LITERAL_TYPE_INFO:
		result = IntegerLiteralTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::INVALID_TYPE_INFO:
		return nullptr;
	case ExtraTypeInfoType::LIST_TYPE_INFO:
		result = ListTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::STRING_TYPE_INFO:
		result = StringTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::STRUCT_TYPE_INFO:
		result = StructTypeInfo::Deserialize(deserializer);
		break;
	case ExtraTypeInfoType::USER_TYPE_INFO:
		result = UserTypeInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ExtraTypeInfo!");
	}
	result->alias = std::move(alias);
	result->extension_info = std::move(extension_info);
	return result;
}